

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O0

void DES_set_key_ex(uint8_t *key,DES_key_schedule *schedule)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  int local_3c;
  int i;
  uint8_t *in;
  uint32_t t2;
  uint32_t s;
  uint32_t t;
  uint32_t d;
  uint32_t c;
  DES_key_schedule *schedule_local;
  uint8_t *key_local;
  
  uVar1 = (*(uint *)(key + 4) >> 4 ^ *(uint *)key) & 0xf0f0f0f;
  uVar2 = uVar1 ^ *(uint *)key;
  uVar1 = uVar1 << 4 ^ *(uint *)(key + 4);
  uVar3 = (uVar2 << 0x12 ^ uVar2) & 0xcccc0000;
  uVar3 = uVar2 ^ uVar3 ^ uVar3 >> 0x12;
  uVar2 = (uVar1 << 0x12 ^ uVar1) & 0xcccc0000;
  uVar2 = uVar1 ^ uVar2 ^ uVar2 >> 0x12;
  uVar1 = (uVar2 >> 1 ^ uVar3) & 0x55555555;
  uVar3 = uVar1 ^ uVar3;
  uVar2 = uVar1 << 1 ^ uVar2;
  uVar1 = (uVar3 >> 8 ^ uVar2) & 0xff00ff;
  uVar2 = uVar1 ^ uVar2;
  uVar3 = uVar1 << 8 ^ uVar3;
  uVar1 = (uVar2 >> 1 ^ uVar3) & 0x55555555;
  uVar3 = uVar1 ^ uVar3;
  uVar2 = uVar1 << 1 ^ uVar2;
  s = (uVar2 & 0xff) << 0x10 | uVar2 & 0xff00 | (uVar2 & 0xff0000) >> 0x10 |
      (uVar3 & 0xf0000000) >> 4;
  t = uVar3 & 0xfffffff;
  for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
    if (DES_set_key_ex::shifts2[local_3c] == 0) {
      t = t >> 1 | t << 0x1b;
      s = s >> 1 | s << 0x1b;
    }
    else {
      t = t >> 2 | t << 0x1a;
      s = s >> 2 | s << 0x1a;
    }
    uVar1 = t & 0xfffffff;
    uVar2 = s & 0xfffffff;
    uVar3 = des_skb[0][t & 0x3f] | des_skb[1][uVar1 >> 6 & 3 | uVar1 >> 7 & 0x3c] |
            des_skb[2][uVar1 >> 0xd & 0xf | uVar1 >> 0xe & 0x30] |
            des_skb[3][uVar1 >> 0x14 & 1 | uVar1 >> 0x15 & 6 | uVar1 >> 0x16 & 0x38];
    uVar4 = des_skb[4][s & 0x3f] | des_skb[5][uVar2 >> 7 & 3 | uVar2 >> 8 & 0x3c] |
            des_skb[6][uVar2 >> 0xf & 0x3f] | des_skb[7][uVar2 >> 0x15 & 0xf | uVar2 >> 0x16 & 0x30]
    ;
    uVar5 = CRYPTO_rotr_u32(uVar4 << 0x10 | uVar3 & 0xffff,0x1e);
    schedule->subkeys[local_3c][0] = uVar5;
    uVar5 = CRYPTO_rotr_u32(uVar3 >> 0x10 | uVar4 & 0xffff0000,0x1a);
    schedule->subkeys[local_3c][1] = uVar5;
    s = uVar2;
    t = uVar1;
  }
  return;
}

Assistant:

void DES_set_key_ex(const uint8_t key[8], DES_key_schedule *schedule) {
  static const int shifts2[16] = {0, 0, 1, 1, 1, 1, 1, 1,
                                  0, 1, 1, 1, 1, 1, 1, 0};
  uint32_t c, d, t, s, t2;
  const uint8_t *in;
  int i;

  in = key;

  c2l(in, c);
  c2l(in, d);

  // do PC1 in 47 simple operations :-)
  // Thanks to John Fletcher (john_fletcher@lccmail.ocf.llnl.gov)
  // for the inspiration. :-)
  PERM_OP(d, c, t, 4, 0x0f0f0f0f);
  HPERM_OP(c, t, -2, 0xcccc0000);
  HPERM_OP(d, t, -2, 0xcccc0000);
  PERM_OP(d, c, t, 1, 0x55555555);
  PERM_OP(c, d, t, 8, 0x00ff00ff);
  PERM_OP(d, c, t, 1, 0x55555555);
  d = (((d & 0x000000ff) << 16) | (d & 0x0000ff00) |
       ((d & 0x00ff0000) >> 16) | ((c & 0xf0000000) >> 4));
  c &= 0x0fffffff;

  for (i = 0; i < ITERATIONS; i++) {
    if (shifts2[i]) {
      c = ((c >> 2) | (c << 26));
      d = ((d >> 2) | (d << 26));
    } else {
      c = ((c >> 1) | (c << 27));
      d = ((d >> 1) | (d << 27));
    }
    c &= 0x0fffffff;
    d &= 0x0fffffff;
    // could be a few less shifts but I am to lazy at this
    // point in time to investigate
    s = des_skb[0][(c) & 0x3f] |
        des_skb[1][((c >> 6) & 0x03) | ((c >> 7) & 0x3c)] |
        des_skb[2][((c >> 13) & 0x0f) | ((c >> 14) & 0x30)] |
        des_skb[3][((c >> 20) & 0x01) | ((c >> 21) & 0x06) |
                   ((c >> 22) & 0x38)];
    t = des_skb[4][(d) & 0x3f] |
        des_skb[5][((d >> 7) & 0x03) | ((d >> 8) & 0x3c)] |
        des_skb[6][(d >> 15) & 0x3f] |
        des_skb[7][((d >> 21) & 0x0f) | ((d >> 22) & 0x30)];

    // table contained 0213 4657
    t2 = ((t << 16) | (s & 0x0000ffff)) & 0xffffffff;
    schedule->subkeys[i][0] = CRYPTO_rotr_u32(t2, 30);

    t2 = ((s >> 16) | (t & 0xffff0000));
    schedule->subkeys[i][1] = CRYPTO_rotr_u32(t2, 26);
  }
}